

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall icu_63::Calendar::computeFields(Calendar *this,UErrorCode *ec)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  UErrorCode *ec_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar6;
  int32_t dstOffset;
  int32_t rawOffset;
  int local_40;
  int local_3c;
  undefined1 local_38 [16];
  
  if (U_ZERO_ERROR < *ec) {
    return;
  }
  dVar6 = this->fTime;
  (*(this->fZone->super_UObject)._vptr_UObject[6])(this->fZone,0,&local_3c,&local_40,ec);
  uVar3 = 0x80067;
  lVar5 = -0x17;
  do {
    this->fStamp[lVar5 + 0x17] = uVar3 & 1 ^ 1;
    *(byte *)((long)this->fStamp + lVar5 + -1) = (byte)(uVar3 & 1) ^ 1;
    uVar3 = uVar3 >> 1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0);
  dVar6 = dVar6 + (double)(local_40 + local_3c);
  dVar1 = uprv_floor_63(dVar6 / 86400000.0);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd;
  this->fFields[0x14] = (int)dVar1 + 0x253d8c;
  this->fStamp[0x14] = 1;
  this->fIsSet[0x14] = '\x01';
  computeGregorianAndDOWFields(this,(int)dVar1 + 0x253d8c,ec_00);
  (*(this->super_UObject)._vptr_UObject[0x29])(this,(ulong)(uint)this->fFields[0x14],ec);
  computeWeekFields(this,ec);
  iVar4 = (int)(dVar6 - (double)(int)(double)local_38._0_8_ * 86400000.0);
  this->fFields[0x15] = iVar4;
  this->fFields[0xe] = iVar4 % 1000;
  this->fFields[0xd] = (iVar4 / 1000) % 0x3c;
  this->fFields[0xc] = (iVar4 / 60000) % 0x3c;
  iVar2 = iVar4 / 3600000;
  this->fFields[0xb] = iVar2;
  this->fFields[9] = iVar4 / 43200000;
  this->fFields[10] = iVar2 + (((uint)(iVar2 / 6 + (iVar2 >> 0x1f)) >> 1) - (iVar2 >> 0x1f)) * -0xc;
  this->fFields[0xf] = local_3c;
  this->fFields[0x10] = local_40;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }